

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<capnp::Orphan<capnp::compiler::Expression>_> * __thiscall
kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::operator=
          (NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *this,
          NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *other)

{
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      capnp::_::OrphanBuilder::~OrphanBuilder(&(this->field_1).value.builder);
    }
    if (other->isSet == true) {
      capnp::_::OrphanBuilder::OrphanBuilder
                (&(this->field_1).value.builder,&(other->field_1).value.builder);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }